

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

Script * __thiscall
cfd::core::Descriptor::GetLockingScript(Script *__return_storage_ptr__,Descriptor *this)

{
  uint32_t uVar1;
  CfdException *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_38;
  
  uVar1 = DescriptorNode::GetNeedArgumentNum(&this->root_node_);
  if (uVar1 == 0) {
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (pointer)0x0;
    local_48._M_allocated_capacity = 0;
    GetLockingScriptAll(&local_38,this,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_58);
    Script::Script(__return_storage_ptr__,
                   (Script *)
                   CONCAT44(local_38.
                            super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint32_t)
                            local_38.
                            super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                            ._M_impl.super__Vector_impl_data._M_start));
    ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
    return __return_storage_ptr__;
  }
  local_58._0_8_ = "cfdcore_descriptor.cpp";
  local_58._8_4_ = 0x86c;
  local_48._M_allocated_capacity = 0x21a3b2;
  local_38.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar1;
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"Failed to empty argument. {}",
             (uint *)&local_38);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = &local_48;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Failed to empty argument. need argument descriptor.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script Descriptor::GetLockingScript() const {
  if (GetNeedArgumentNum() != 0) {
    warn(CFD_LOG_SOURCE, "Failed to empty argument. {}", GetNeedArgumentNum());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to empty argument. need argument descriptor.");
  }
  std::vector<std::string> list;
  return GetLockingScriptAll(&list)[0];
}